

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

Inst * __thiscall mir::inst::PhiInst::deep_copy(PhiInst *this)

{
  PhiInst *this_00;
  VarId local_38;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_28;
  
  this_00 = (PhiInst *)operator_new(0x40);
  local_38.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_38.id = (this->super_Inst).dest.id;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_28,&this->vars);
  PhiInst(this_00,&local_38,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_28
         );
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base(&local_28);
  return &this_00->super_Inst;
}

Assistant:

Inst* deep_copy() { return new PhiInst(dest, vars); }